

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O3

XmlRpcValue * __thiscall XmlRpc::XmlRpcValue::operator=(XmlRpcValue *this,XmlRpcValue *rhs)

{
  Type TVar1;
  BinaryData *pBVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 uVar13;
  tm *ptVar14;
  tm *ptVar15;
  
  if (this == rhs) {
    return this;
  }
  invalidate(this);
  TVar1 = rhs->_type;
  this->_type = TVar1;
  switch(TVar1) {
  case TypeBoolean:
    (this->_value).asBool = (rhs->_value).asBool;
    break;
  case TypeInt:
    (this->_value).asInt = (rhs->_value).asInt;
    break;
  case TypeDouble:
    this->_value = rhs->_value;
    break;
  case TypeString:
    ptVar15 = (tm *)operator_new(0x20);
    pBVar2 = (rhs->_value).asBinary;
    *(int **)ptVar15 = &ptVar15->tm_mon;
    pcVar3 = (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_construct<char*>
              ((string *)ptVar15,pcVar3,
               (pBVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish + (long)pcVar3);
    goto LAB_0024e5af;
  case TypeDateTime:
    ptVar14 = (tm *)operator_new(0x38);
    ptVar15 = (rhs->_value).asTime;
    iVar5 = ptVar15->tm_min;
    iVar6 = ptVar15->tm_hour;
    iVar7 = ptVar15->tm_mday;
    iVar8 = ptVar15->tm_mon;
    iVar9 = ptVar15->tm_year;
    iVar10 = ptVar15->tm_wday;
    iVar11 = ptVar15->tm_yday;
    iVar12 = ptVar15->tm_isdst;
    uVar13 = *(undefined4 *)&ptVar15->field_0x24;
    lVar4 = ptVar15->tm_gmtoff;
    ptVar14->tm_sec = ptVar15->tm_sec;
    ptVar14->tm_min = iVar5;
    ptVar14->tm_hour = iVar6;
    ptVar14->tm_mday = iVar7;
    ptVar14->tm_mon = iVar8;
    ptVar14->tm_year = iVar9;
    ptVar14->tm_wday = iVar10;
    ptVar14->tm_yday = iVar11;
    ptVar14->tm_isdst = iVar12;
    *(undefined4 *)&ptVar14->field_0x24 = uVar13;
    ptVar14->tm_gmtoff = lVar4;
    ptVar14->tm_zone = ptVar15->tm_zone;
    (this->_value).asTime = ptVar14;
    break;
  case TypeBase64:
    ptVar15 = (tm *)operator_new(0x18);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)ptVar15,
               (vector<char,_std::allocator<char>_> *)(rhs->_value).asTime);
    goto LAB_0024e5af;
  case TypeArray:
    ptVar15 = (tm *)operator_new(0x18);
    std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::vector
              ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)ptVar15,
               (vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
               (rhs->_value).asTime);
    goto LAB_0024e5af;
  case TypeStruct:
    ptVar15 = (tm *)operator_new(0x30);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                *)ptVar15,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                *)(rhs->_value).asTime);
LAB_0024e5af:
    (this->_value).asTime = ptVar15;
    break;
  default:
    (this->_value).asDouble = 0.0;
  }
  return this;
}

Assistant:

XmlRpcValue& XmlRpcValue::operator=(XmlRpcValue const& rhs)
  {
    if (this != &rhs)
    {
      invalidate();
      _type = rhs._type;
      switch (_type) {
        case TypeBoolean:  _value.asBool = rhs._value.asBool; break;
        case TypeInt:      _value.asInt = rhs._value.asInt; break;
        case TypeDouble:   _value.asDouble = rhs._value.asDouble; break;
        case TypeDateTime: _value.asTime = new struct tm(*rhs._value.asTime); break;
        case TypeString:   _value.asString = new std::string(*rhs._value.asString); break;
        case TypeBase64:   _value.asBinary = new BinaryData(*rhs._value.asBinary); break;
        case TypeArray:    _value.asArray = new ValueArray(*rhs._value.asArray); break;
        case TypeStruct:   _value.asStruct = new ValueStruct(*rhs._value.asStruct); break;
        default:           _value.asBinary = 0; break;
      }
    }
    return *this;
  }